

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void lexerror(LexState *ls,char *msg,int token)

{
  lua_State *L;
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = luaG_addinfo(ls->L,msg,ls->source,ls->linenumber);
  if (token != 0) {
    L = ls->L;
    if (token - 0x122U < 4) {
      save(ls,0);
      pcVar2 = luaO_pushfstring(ls->L,"\'%s\'",ls->buff->buffer);
    }
    else {
      pcVar2 = luaX_token2str(ls,token);
    }
    luaO_pushfstring(L,"%s near %s",pcVar1,pcVar2);
  }
  luaD_throw(ls->L,3);
}

Assistant:

static l_noret lexerror (LexState *ls, const char *msg, int token) {
  msg = luaG_addinfo(ls->L, msg, ls->source, ls->linenumber);
  if (token)
    luaO_pushfstring(ls->L, "%s near %s", msg, txtToken(ls, token));
  luaD_throw(ls->L, LUA_ERRSYNTAX);
}